

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O2

void Res_SimAdjust(Res_Sim_t *p,Abc_Ntk_t *pAig,int nTruePis)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  
  srand(0xabc);
  if (pAig->ntkType == ABC_NTK_STRASH) {
    p->pAig = pAig;
    p->nTruePis = nTruePis;
    if (p->vPats->nSize <= pAig->vObjs->nSize) {
      Vec_PtrFree(p->vPats);
      pVVar1 = Vec_PtrAllocSimInfo(pAig->vObjs->nSize + 1,p->nWordsIn);
      p->vPats = pVVar1;
    }
    if (p->vPats0->nSize < nTruePis) {
      Vec_PtrFree(p->vPats0);
      pVVar1 = Vec_PtrAllocSimInfo(nTruePis,p->nWords);
      p->vPats0 = pVVar1;
    }
    if (p->vPats1->nSize < nTruePis) {
      Vec_PtrFree(p->vPats1);
      pVVar1 = Vec_PtrAllocSimInfo(nTruePis,p->nWords);
      p->vPats1 = pVVar1;
    }
    if (p->vOuts->nSize < pAig->vPos->nSize) {
      Vec_PtrFree(p->vOuts);
      pVVar1 = Vec_PtrAllocSimInfo(pAig->vPos->nSize,p->nWordsOut);
      p->vOuts = pVVar1;
    }
    pvVar2 = Vec_PtrEntry(p->vPats0,0);
    memset(pvVar2,0,(long)p->nWords * (long)nTruePis * 4);
    pvVar2 = Vec_PtrEntry(p->vPats1,0);
    memset(pvVar2,0,(long)p->nWords * (long)nTruePis * 4);
    p->nPats0 = 0;
    p->nPats1 = 0;
    p->fConst0 = 0;
    p->fConst1 = 0;
    return;
  }
  __assert_fail("Abc_NtkIsStrash(pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                ,0x54,"void Res_SimAdjust(Res_Sim_t *, Abc_Ntk_t *, int)");
}

Assistant:

void Res_SimAdjust( Res_Sim_t * p, Abc_Ntk_t * pAig, int nTruePis )
{
    srand( 0xABC );

    assert( Abc_NtkIsStrash(pAig) );
    p->pAig = pAig;
    p->nTruePis = nTruePis;
    if ( Vec_PtrSize(p->vPats) < Abc_NtkObjNumMax(pAig)+1 )
    {
        Vec_PtrFree( p->vPats );
        p->vPats = Vec_PtrAllocSimInfo( Abc_NtkObjNumMax(pAig)+1, p->nWordsIn );
    }
    if ( Vec_PtrSize(p->vPats0) < nTruePis )
    {
        Vec_PtrFree( p->vPats0 );
        p->vPats0 = Vec_PtrAllocSimInfo( nTruePis, p->nWords );
    }
    if ( Vec_PtrSize(p->vPats1) < nTruePis )
    {
        Vec_PtrFree( p->vPats1 );
        p->vPats1 = Vec_PtrAllocSimInfo( nTruePis, p->nWords );
    }
    if ( Vec_PtrSize(p->vOuts) < Abc_NtkPoNum(pAig) )
    {
        Vec_PtrFree( p->vOuts );
        p->vOuts = Vec_PtrAllocSimInfo( Abc_NtkPoNum(pAig), p->nWordsOut );
    }
    // clean storage info for patterns
    Abc_InfoClear( (unsigned *)Vec_PtrEntry(p->vPats0,0), p->nWords * nTruePis );
    Abc_InfoClear( (unsigned *)Vec_PtrEntry(p->vPats1,0), p->nWords * nTruePis );
    p->nPats0 = 0;
    p->nPats1 = 0;
    p->fConst0 = 0;
    p->fConst1 = 0;
}